

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::ArraySortMethod::eval
          (ArraySortMethod *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *callInfo)

{
  bool bVar1;
  EvalContext *this_00;
  type *ppEVar2;
  anon_class_32_4_145c4b1f *this_01;
  type pEVar3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  EvalContext *in_RSI;
  ConstantValue *in_RDI;
  pair<const_slang::ast::Expression_*,_const_slang::ast::ValueSymbol_*> pVar4;
  vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *vec_1;
  anon_class_8_1_8991fb9c sortTarget_1;
  vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *vec;
  anon_class_32_4_145c4b1f sortTarget;
  ConstantValue *iterVal;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_EvalContext_h:113:13)>
  guard;
  type *iterVar;
  type *iterExpr;
  ConstantValue *target;
  LValue lval;
  vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *in_stack_fffffffffffffd18;
  EvalContext *in_stack_fffffffffffffd20;
  Expression *in_stack_fffffffffffffd28;
  SystemCallInfo *in_stack_fffffffffffffd30;
  LValue *in_stack_fffffffffffffd38;
  vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *in_stack_fffffffffffffd48;
  EvalContext *this_02;
  SVQueue *in_stack_fffffffffffffda8;
  type target_00;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffffdb0;
  anon_class_32_4_145c4b1f *this_03;
  type local_210;
  SVQueue *in_stack_fffffffffffffe08;
  
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  Expression::evalLValue(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  bVar1 = LValue::operator_cast_to_bool((LValue *)0x9370e1);
  if (bVar1) {
    this_00 = (EvalContext *)LValue::resolve(in_stack_fffffffffffffd38);
    if (this_00 == (EvalContext *)0x0) {
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    }
    else {
      this_02 = this_00;
      pVar4 = CallExpression::SystemCallInfo::getIteratorInfo(in_stack_fffffffffffffd30);
      ppEVar2 = std::get<0ul,slang::ast::Expression_const*,slang::ast::ValueSymbol_const*>
                          ((pair<const_slang::ast::Expression_*,_const_slang::ast::ValueSymbol_*> *)
                           0x9371b6);
      this_01 = (anon_class_32_4_145c4b1f *)
                std::get<1ul,slang::ast::Expression_const*,slang::ast::ValueSymbol_const*>
                          ((pair<const_slang::ast::Expression_*,_const_slang::ast::ValueSymbol_*> *)
                           0x9371cb);
      if (*ppEVar2 == (type)0x0) {
        bVar1 = slang::ConstantValue::isQueue((ConstantValue *)0x9373a8);
        if (bVar1) {
          in_stack_fffffffffffffd20 =
               (EvalContext *)slang::ConstantValue::queue((ConstantValue *)0x9373bb);
          CopyPtr<slang::SVQueue>::operator*((CopyPtr<slang::SVQueue> *)0x9373cc);
          const::{lambda(auto:1&)#2}::operator()
                    (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
        }
        else {
          slang::ConstantValue::getVariant_abi_cxx11_((ConstantValue *)this_00);
          in_stack_fffffffffffffd18 =
               std::
               get<std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                         ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)0x9373f5);
          const::{lambda(auto:1&)#2}::operator()
                    ((anon_class_8_1_8991fb9c *)pVar4.second,in_stack_fffffffffffffd48);
        }
      }
      else {
        EvalContext::disableCaching(in_RSI);
        slang::ConstantValue::ConstantValue
                  ((ConstantValue *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
        pEVar3 = (type)EvalContext::createLocal
                                 (this_02,(ValueSymbol *)pVar4.first,(ConstantValue *)pVar4.second);
        slang::ConstantValue::~ConstantValue((ConstantValue *)0x93725d);
        target_00 = *ppEVar2;
        this_03 = (anon_class_32_4_145c4b1f *)&local_210;
        local_210 = pEVar3;
        bVar1 = slang::ConstantValue::isQueue((ConstantValue *)0x9372b7);
        if (bVar1) {
          slang::ConstantValue::queue((ConstantValue *)0x9372ca);
          CopyPtr<slang::SVQueue>::operator*((CopyPtr<slang::SVQueue> *)0x9372db);
          const::{lambda(auto:1&)#1}::operator()(this_01,in_stack_fffffffffffffe08);
        }
        else {
          slang::ConstantValue::getVariant_abi_cxx11_((ConstantValue *)this_00);
          std::
          get<std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                    ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                      *)0x93733d);
          const::{lambda(auto:1&)#1}::operator()
                    (this_03,(vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                             target_00);
        }
        ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/../include/slang/ast/EvalContext.h:113:13)>
        ::~ScopeGuard((ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_EvalContext_h:113:13)>
                       *)in_stack_fffffffffffffd20);
      }
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    }
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  }
  LValue::~LValue((LValue *)0x937444);
  return in_RDI;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo& callInfo) const final {
        auto lval = args[0]->evalLValue(context);
        if (!lval)
            return nullptr;

        auto target = lval.resolve();
        if (!target)
            return nullptr;

        auto [iterExpr, iterVar] = callInfo.getIteratorInfo();
        if (iterExpr) {
            SLANG_ASSERT(iterVar);
            auto guard = context.disableCaching();
            auto iterVal = context.createLocal(iterVar);

            auto sortTarget = [&, ie = iterExpr](auto& target) {
                auto pred = [&, ie = ie](ConstantValue& a, ConstantValue& b) {
                    *iterVal = a;
                    ConstantValue cva = ie->eval(context);

                    *iterVal = b;
                    ConstantValue cvb = ie->eval(context);

                    return cva < cvb;
                };

                if (reversed)
                    std::ranges::sort(target.rbegin(), target.rend(), pred);
                else
                    std::ranges::sort(target, pred);
            };

            if (target->isQueue()) {
                sortTarget(*target->queue());
            }
            else {
                auto& vec = std::get<ConstantValue::Elements>(target->getVariant());
                sortTarget(vec);
            }
        }
        else {
            auto sortTarget = [&](auto& target) {
                if (reversed)
                    std::ranges::sort(target.rbegin(), target.rend(), std::less<>{});
                else
                    std::ranges::sort(target, std::less<>{});
            };

            if (target->isQueue()) {
                sortTarget(*target->queue());
            }
            else {
                auto& vec = std::get<ConstantValue::Elements>(target->getVariant());
                sortTarget(vec);
            }
        }

        return nullptr;
    }